

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

void golemeffects(monst *mon,int damtype,int dam)

{
  bool bVar1;
  char *pcVar2;
  int local_1c;
  int slow;
  int heal;
  int dam_local;
  int damtype_local;
  monst *mon_local;
  
  local_1c = 0;
  bVar1 = false;
  if (mon->data == mons + 0x106) {
    if (damtype == 6) {
      local_1c = dam / 6;
    }
    else if ((damtype == 2) || (damtype == 3)) {
      bVar1 = true;
    }
  }
  else {
    if (mon->data != mons + 0x10a) {
      return;
    }
    if (damtype == 6) {
      bVar1 = true;
    }
    else if (damtype == 2) {
      local_1c = dam;
    }
  }
  if ((bVar1) && ((*(uint *)&mon->field_0x60 >> 10 & 3) != 1)) {
    mon_adjust_speed(mon,-1,(obj *)0x0);
  }
  if ((local_1c != 0) && (mon->mhp < mon->mhpmax)) {
    mon->mhp = dam + mon->mhp;
    if (mon->mhpmax < mon->mhp) {
      mon->mhp = mon->mhpmax;
    }
    if ((viz_array[mon->my][mon->mx] & 2U) != 0) {
      pcVar2 = Monnam(mon);
      pline("%s seems healthier.",pcVar2);
    }
  }
  return;
}

Assistant:

void golemeffects(struct monst *mon, int damtype, int dam)
{
    int heal = 0, slow = 0;

    if (mon->data == &mons[PM_FLESH_GOLEM]) {
	if (damtype == AD_ELEC) heal = dam / 6;
	else if (damtype == AD_FIRE || damtype == AD_COLD) slow = 1;
    } else if (mon->data == &mons[PM_IRON_GOLEM]) {
	if (damtype == AD_ELEC) slow = 1;
	else if (damtype == AD_FIRE) heal = dam;
    } else {
	return;
    }
    if (slow) {
	if (mon->mspeed != MSLOW)
	    mon_adjust_speed(mon, -1, NULL);
    }
    if (heal) {
	if (mon->mhp < mon->mhpmax) {
	    mon->mhp += dam;
	    if (mon->mhp > mon->mhpmax) mon->mhp = mon->mhpmax;
	    if (cansee(mon->mx, mon->my))
		pline("%s seems healthier.", Monnam(mon));
	}
    }
}